

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

AddrInfo * __thiscall
AddrManImpl::Create(AddrManImpl *this,CAddress *addr,CNetAddr *addrSource,int *pnId)

{
  unordered_map<int,_AddrInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_AddrInfo>_>_>
  *this_00;
  pointer piVar1;
  pointer piVar2;
  iterator __position;
  int iVar3;
  Network NVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  long in_FS_OFFSET;
  int nId;
  int local_bc;
  direct_or_indirect local_b8;
  uint local_a8;
  undefined8 local_a0;
  uint16_t local_98;
  rep local_90;
  ServiceFlags SStack_88;
  rep local_80;
  rep rStack_78;
  char *local_70;
  undefined8 uStack_68;
  size_type local_60;
  undefined8 local_58;
  rep local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_bc = this->nIdCount;
  this->nIdCount = local_bc + 1;
  AddrInfo::AddrInfo((AddrInfo *)&local_b8.indirect_contents,addr,addrSource);
  this_00 = &this->mapInfo;
  pmVar5 = std::__detail::
           _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_bc);
  if (0x10 < (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._size) {
    free((pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._union.indirect_contents.
         indirect);
  }
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       local_b8.indirect_contents.indirect;
  *(undefined8 *)((long)&(pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._union + 8) =
       local_b8._8_8_;
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._size = local_a8;
  local_a8 = 0;
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_net = (undefined4)local_a0;
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_scope_id = local_a0._4_4_;
  (pmVar5->super_CAddress).super_CService.port = local_98;
  (pmVar5->super_CAddress).nTime.__d.__r = local_90;
  (pmVar5->super_CAddress).nServices = SStack_88;
  (pmVar5->m_last_try).__d.__r = local_80;
  (pmVar5->m_last_count_attempt).__d.__r = rStack_78;
  if (0x10 < (pmVar5->source).m_addr._size) {
    free((pmVar5->source).m_addr._union.indirect_contents.indirect);
  }
  (pmVar5->source).m_addr._union.indirect_contents.indirect = local_70;
  *(undefined8 *)((long)&(pmVar5->source).m_addr._union + 8) = uStack_68;
  (pmVar5->source).m_addr._size = local_60;
  local_60 = 0;
  (pmVar5->source).m_net = (undefined4)local_58;
  (pmVar5->source).m_scope_id = local_58._4_4_;
  pmVar5->fInTried = (bool)(undefined1)local_40;
  *(undefined3 *)&pmVar5->field_0x79 = local_40._1_3_;
  pmVar5->nRandomPos = local_40._4_4_;
  (pmVar5->m_last_success).__d.__r = local_50;
  pmVar5->nAttempts = (undefined4)uStack_48;
  pmVar5->nRefCount = uStack_48._4_4_;
  if (0x10 < local_a8) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  iVar3 = local_bc;
  pmVar6 = std::__detail::
           _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->mapAddr,&addr->super_CService);
  *pmVar6 = iVar3;
  piVar1 = (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar5 = std::__detail::
           _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_bc);
  pmVar5->nRandomPos = (int)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  __position._M_current =
       (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->vRandom,__position,&local_bc);
  }
  else {
    *__position._M_current = local_bc;
    (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  this->nNew = this->nNew + 1;
  NVar4 = CNetAddr::GetNetwork((CNetAddr *)addr);
  local_b8._0_4_ = NVar4;
  pmVar7 = std::__detail::
           _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_network_counts,(key_type *)local_b8.direct);
  pmVar7->n_new = pmVar7->n_new + 1;
  if (pnId != (int *)0x0) {
    *pnId = local_bc;
  }
  pmVar5 = std::__detail::
           _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_bc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pmVar5;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo* AddrManImpl::Create(const CAddress& addr, const CNetAddr& addrSource, int* pnId)
{
    AssertLockHeld(cs);

    int nId = nIdCount++;
    mapInfo[nId] = AddrInfo(addr, addrSource);
    mapAddr[addr] = nId;
    mapInfo[nId].nRandomPos = vRandom.size();
    vRandom.push_back(nId);
    nNew++;
    m_network_counts[addr.GetNetwork()].n_new++;
    if (pnId)
        *pnId = nId;
    return &mapInfo[nId];
}